

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

int MOJOSHADER_glAvailableProfiles
              (MOJOSHADER_glGetProcAddress lookup,void *lookup_d,char **profs,int size,
              MOJOSHADER_malloc m,MOJOSHADER_free f,void *malloc_d)

{
  char *profile_00;
  MOJOSHADER_glContext *pMVar1;
  int iVar2;
  char *profile;
  size_t i;
  MOJOSHADER_glContext *current_ctx;
  MOJOSHADER_glContext _ctx;
  code *pcStack_40;
  int retval;
  MOJOSHADER_free f_local;
  MOJOSHADER_malloc m_local;
  int size_local;
  char **profs_local;
  void *lookup_d_local;
  MOJOSHADER_glGetProcAddress lookup_local;
  
  pMVar1 = ctx;
  _ctx.profileMustPushSamplers._4_4_ = 0;
  f_local = (MOJOSHADER_free)m;
  if (m == (MOJOSHADER_malloc)0x0) {
    f_local = MOJOSHADER_internal_malloc;
  }
  pcStack_40 = f;
  if (f == (MOJOSHADER_free)0x0) {
    pcStack_40 = MOJOSHADER_internal_free;
  }
  ctx = (MOJOSHADER_glContext *)&current_ctx;
  memset(ctx,0,0x513f8);
  ctx->malloc_fn = (MOJOSHADER_malloc)f_local;
  ctx->free_fn = pcStack_40;
  ctx->malloc_data = malloc_d;
  load_extensions(lookup,lookup_d);
  if (ctx->have_opengl_es == 0) {
    if (ctx->have_core_opengl != 0) {
      for (profile = (char *)0x0; profile < (char *)0x6; profile = profile + 1) {
        profile_00 = profile_priorities[(long)profile];
        iVar2 = valid_profile(profile_00);
        if (iVar2 != 0) {
          if (_ctx.profileMustPushSamplers._4_4_ < size) {
            profs[_ctx.profileMustPushSamplers._4_4_] = profile_00;
          }
          _ctx.profileMustPushSamplers._4_4_ = _ctx.profileMustPushSamplers._4_4_ + 1;
        }
      }
    }
    lookup_local._4_4_ = _ctx.profileMustPushSamplers._4_4_;
    ctx = pMVar1;
  }
  else {
    *profs = "glsles";
    lookup_local._4_4_ = 1;
  }
  return lookup_local._4_4_;
}

Assistant:

int MOJOSHADER_glAvailableProfiles(MOJOSHADER_glGetProcAddress lookup,
                                   void *lookup_d,
                                   const char **profs, const int size,
                                   MOJOSHADER_malloc m, MOJOSHADER_free f,
                                   void *malloc_d)
{
    int retval = 0;
    MOJOSHADER_glContext _ctx;
    MOJOSHADER_glContext *current_ctx = ctx;

    if (m == NULL) m = MOJOSHADER_internal_malloc;
    if (f == NULL) f = MOJOSHADER_internal_free;

    ctx = &_ctx;
    memset(ctx, '\0', sizeof (MOJOSHADER_glContext));
    ctx->malloc_fn = m;
    ctx->free_fn = f;
    ctx->malloc_data = malloc_d;

    load_extensions(lookup, lookup_d);

#if SUPPORT_PROFILE_GLSLES
    if (ctx->have_opengl_es)
    {
        profs[0] = MOJOSHADER_PROFILE_GLSLES;
        return 1;
    } // if
#endif

    if (ctx->have_core_opengl)
    {
        size_t i;
        for (i = 0; i < STATICARRAYLEN(profile_priorities); i++)
        {
            const char *profile = profile_priorities[i];
            if (valid_profile(profile))
            {
                if (retval < size)
                    profs[retval] = profile;
                retval++;
            } // if
        } // for
    } // if

    ctx = current_ctx;
    return retval;
}